

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_types.cpp
# Opt level: O3

void __thiscall
ArchiveSpan_ReadSingleElementSpan_Test::TestBody(ArchiveSpan_ReadSingleElementSpan_Test *this)

{
  FunctionMocker<void_(int_&)> *this_00;
  span<unsigned_char,__1L> sp;
  TypedExpectation<void_(int_&)> *this_01;
  TypedExpectation<void_(pstore::gsl::span<int,__1L>)> *this_02;
  _func_int *message;
  type uninit_buffer;
  array<int,_1UL> a;
  mock_span_archive archive;
  undefined1 local_1b0 [8];
  MatcherBase<pstore::gsl::span<int,__1L>_> local_1a8;
  SetArgRefereeAction<0UL,_int> local_18c;
  int iVar1;
  undefined4 uVar2;
  undefined1 *puVar3;
  MatcherBase<int_&> local_160;
  mock_span_archive local_148;
  
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            ((UntypedFunctionMockerBase *)&local_148);
  local_148.gmock01_put_280.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198a70;
  this_00 = &local_148.gmock01_get_281;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&this_00->super_UntypedFunctionMockerBase);
  local_148.gmock01_get_281.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198bd0;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_148.gmock01_putn_mock_285.super_UntypedFunctionMockerBase);
  local_148.gmock01_putn_mock_285.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198e28;
  testing::internal::UntypedFunctionMockerBase::UntypedFunctionMockerBase
            (&local_148.gmock01_getn_mock_286.super_UntypedFunctionMockerBase);
  local_148.gmock01_getn_mock_286.super_UntypedFunctionMockerBase._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMocker_00198f88;
  local_160.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<int&>::
       GetVTable<testing::internal::MatcherBase<int&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_160.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_00198c90;
  anon_unknown.dwarf_7baea::ArchiveSpan::mock_span_archive::gmock_get
            ((MockSpec<void_(int_&)> *)local_1b0,&local_148,(Matcher<int_&> *)&local_160);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<void_(int_&)>::InternalExpectedAt
                      ((MockSpec<void_(int_&)> *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x164,"archive","get (_)");
  local_18c.value = 0x17;
  std::function<void(int&)>::operator=((function<void(int&)> *)&stack0xfffffffffffffe78,&local_18c);
  testing::internal::TypedExpectation<void_(int_&)>::WillOnce
            (this_01,(Action<void_(int_&)> *)&stack0xfffffffffffffe78);
  testing::internal::MatcherBase<int_&>::~MatcherBase((MatcherBase<int_&> *)(local_1b0 + 8));
  testing::internal::MatcherBase<int_&>::~MatcherBase(&local_160);
  puVar3 = testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::
           GetVTable<testing::internal::MatcherBase<pstore::gsl::span<int,-1l>>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
           ::kVTable;
  iVar1 = 0x198ee8;
  uVar2 = 0;
  anon_unknown.dwarf_7baea::ArchiveSpan::mock_span_archive::gmock_getn_mock
            ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)local_1b0,&local_148,
             (Matcher<pstore::gsl::span<int,__1L>_> *)&stack0xfffffffffffffe78);
  testing::internal::GetWithoutMatchers();
  this_02 = testing::internal::MockSpec<void_(pstore::gsl::span<int,_-1L>)>::InternalExpectedAt
                      ((MockSpec<void_(pstore::gsl::span<int,__1L>)> *)local_1b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
                       ,0x165,"archive","getn_mock (_)");
  testing::internal::TypedExpectation<void_(pstore::gsl::span<int,_-1L>)>::Times(this_02,0);
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)(local_1b0 + 8));
  testing::internal::MatcherBase<pstore::gsl::span<int,_-1L>_>::~MatcherBase
            ((MatcherBase<pstore::gsl::span<int,__1L>_> *)&stack0xfffffffffffffe78);
  sp.storage_.super_extent_type<_1L>.size_._4_4_ = uVar2;
  sp.storage_.super_extent_type<_1L>.size_._0_4_ = iVar1;
  sp.storage_.data_ = puVar3;
  pstore::serialize::flood<_1l>(sp);
  testing::internal::UntypedFunctionMockerBase::SetOwnerAndName
            (&this_00->super_UntypedFunctionMockerBase,&local_148,"get");
  testing::internal::FunctionMocker<void_(int_&)>::Invoke(this_00,(int *)local_1b0);
  local_18c.value = local_1b0._0_4_;
  iVar1 = 0x17;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_1b0,"a[0]","23",&local_18c.value,(int *)&stack0xfffffffffffffe78);
  if (local_1b0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&stack0xfffffffffffffe78);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x171e33;
    }
    else {
      message = *local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/serialize/test_types.cpp"
               ,0x169,(char *)message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&local_160,(Message *)&stack0xfffffffffffffe78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_160);
    if ((long *)CONCAT44(uVar2,iVar1) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uVar2,iVar1) + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_1b0 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_1a8.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  testing::internal::FunctionMocker<void_(pstore::gsl::span<int,_-1L>)>::~FunctionMocker
            (&local_148.gmock01_getn_mock_286);
  testing::internal::
  FunctionMocker<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::
  ~FunctionMocker(&local_148.gmock01_putn_mock_285);
  testing::internal::FunctionMocker<void_(int_&)>::~FunctionMocker(this_00);
  testing::internal::FunctionMocker<pstore::serialize::archive::void_type_(const_int_&)>::
  ~FunctionMocker(&local_148.gmock01_put_280);
  return;
}

Assistant:

TEST_F (ArchiveSpan, ReadSingleElementSpan) {
    using ::testing::_;
    using ::testing::SetArgReferee;

    mock_span_archive archive;
    EXPECT_CALL (archive, get (_)).WillOnce (SetArgReferee<0> (23));
    EXPECT_CALL (archive, getn_mock (_)).Times (0);

    std::array<int, 1> a;
    pstore::serialize::read (archive, ::pstore::gsl::make_span (a));
    EXPECT_EQ (a[0], 23);
}